

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O2

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  dynbuf *s;
  char cVar2;
  int *piVar3;
  long lVar4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  curlfiletype cVar8;
  fileinfo *pfVar9;
  size_t sVar10;
  char *pcVar11;
  void *pvVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sStack_70;
  char c;
  ulong local_58;
  char *endptr;
  Curl_easy *local_48;
  curl_off_t hlinks;
  char *local_38;
  
  uVar15 = size * nmemb;
  piVar3 = (int *)**(undefined8 **)(*(long *)((long)connptr + 0x13c8) + 0x30);
  if (piVar3[3] != 0) {
LAB_0012dfa0:
    if (*(fileinfo **)(piVar3 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar3 + 4));
      piVar3[4] = 0;
      piVar3[5] = 0;
    }
    return uVar15;
  }
  if ((uVar15 != 0) && (*piVar3 == 0)) {
    *piVar3 = ((byte)(*buffer - 0x30U) < 10) + 1;
  }
  uVar14 = 0;
  local_58 = uVar15;
  local_48 = (Curl_easy *)connptr;
  local_38 = buffer;
LAB_0012d3de:
  uVar15 = local_58;
  if (local_58 <= uVar14) {
    return local_58;
  }
  c = local_38[uVar14];
  pfVar9 = *(fileinfo **)(piVar3 + 4);
  if (pfVar9 == (fileinfo *)0x0) {
    pfVar9 = Curl_fileinfo_alloc();
    *(fileinfo **)(piVar3 + 4) = pfVar9;
    if (pfVar9 != (fileinfo *)0x0) {
      piVar3[8] = 0;
      piVar3[9] = 0;
      piVar3[6] = 0;
      Curl_dyn_init(&pfVar9->buf,10000);
      pfVar9 = *(fileinfo **)(piVar3 + 4);
      goto LAB_0012d42b;
    }
LAB_0012df75:
    piVar3[3] = 0x1b;
    goto LAB_0012dfa0;
  }
LAB_0012d42b:
  s = &pfVar9->buf;
  CVar5 = Curl_dyn_addn(s,&c,1);
  if (CVar5 != CURLE_OK) goto LAB_0012df75;
  sVar10 = Curl_dyn_len(s);
  pcVar11 = Curl_dyn_ptr(s);
  if (*piVar3 == 2) {
    switch(piVar3[1]) {
    case 0:
      uVar7 = piVar3[6] + 1;
      piVar3[6] = uVar7;
      if (uVar7 < 9) {
        pcVar11 = "0123456789-";
        sStack_70 = 0xc;
LAB_0012d94c:
        pvVar12 = memchr(pcVar11,(int)c,sStack_70);
        if (pvVar12 == (void *)0x0) goto LAB_0012df89;
        break;
      }
      if ((uVar7 != 9) || (c != ' ')) {
LAB_0012df98:
        piVar3[3] = 0x57;
        uVar15 = local_58;
        goto LAB_0012dfa0;
      }
      piVar3[1] = 1;
      piVar3[2] = 0;
      break;
    case 1:
      iVar6 = piVar3[6];
      piVar3[6] = iVar6 + 1U;
      if (piVar3[2] == 1) {
        if (c != ' ') {
          pcVar11 = "APM0123456789:";
          sStack_70 = 0xf;
          goto LAB_0012d94c;
        }
        *(long *)(piVar3 + 0x10) = *(long *)(piVar3 + 8);
        pcVar11[((ulong)(iVar6 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        piVar3[1] = 2;
        piVar3[2] = 0;
LAB_0012d8c9:
        piVar3[6] = 0;
      }
      else if (((piVar3[2] == 0) && (c != '\t')) && (c != ' ')) {
LAB_0012dc63:
        piVar3[2] = 1;
      }
      break;
    case 2:
      iVar6 = piVar3[2];
      if (iVar6 != 1) goto LAB_0012d877;
      iVar6 = piVar3[6];
      piVar3[6] = iVar6 + 1U;
      if (c == ' ') {
        pcVar11[((ulong)(iVar6 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        lVar13 = *(long *)(piVar3 + 8);
        iVar6 = strcmp("<DIR>",pcVar11 + lVar13);
        if (iVar6 == 0) {
          (pfVar9->info).filetype = CURLFILETYPE_DIRECTORY;
          (pfVar9->info).size = 0;
          lVar13 = *(long *)(piVar3 + 4);
        }
        else {
          endptr = pcVar11 + lVar13;
          iVar6 = Curl_str_numblanks(&endptr,&(pfVar9->info).size);
          if (iVar6 != 0) goto LAB_0012df89;
          lVar13 = *(long *)(piVar3 + 4);
          *(undefined4 *)(lVar13 + 8) = 0;
        }
        *(byte *)(lVar13 + 0x60) = *(byte *)(lVar13 + 0x60) | 0x40;
LAB_0012df1f:
        piVar3[6] = 0;
        piVar3[1] = 3;
        piVar3[2] = 0;
      }
      break;
    case 3:
      iVar6 = piVar3[2];
      if (iVar6 == 2) {
        if (c != '\n') goto LAB_0012df89;
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
      }
      else {
        if (iVar6 != 1) goto LAB_0012d877;
        piVar3[6] = piVar3[6] + 1;
        if (c != '\n') {
          if (c == '\r') {
            piVar3[2] = 2;
            pcVar11[sVar10 - 1] = '\0';
          }
          break;
        }
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
        pcVar11[sVar10 - 1] = '\0';
      }
      ftp_pl_insert_finfo(local_48,pfVar9);
      piVar3[1] = 0;
      piVar3[2] = 0;
    }
  }
  else {
    if (*piVar3 != 1) {
      uVar15 = local_58 + 1;
      goto LAB_0012dfa0;
    }
    switch(piVar3[1]) {
    case 0:
      if (piVar3[2] == 1) {
        uVar7 = piVar3[6];
        piVar3[6] = uVar7 + 1;
        if (c == '\n') {
          pcVar11[uVar7] = '\0';
          iVar6 = strncmp("total ",pcVar11,6);
          if (iVar6 == 0) {
            endptr = pcVar11 + 6;
            Curl_str_passblanks(&endptr);
            pcVar11 = endptr;
            do {
              endptr = pcVar11;
              pcVar11 = endptr + 1;
            } while ((byte)(*endptr - 0x30U) < 10);
            if (*endptr == '\0') {
              piVar3[1] = 1;
              Curl_dyn_reset(s);
              break;
            }
          }
          goto LAB_0012df89;
        }
        if (c == '\r') {
          piVar3[6] = uVar7;
          Curl_dyn_setlen(s,sVar10 - 1);
        }
        break;
      }
      if (piVar3[2] != 0) break;
      if (c == 't') {
        piVar3[2] = 1;
        piVar3[6] = piVar3[6] + 1;
        break;
      }
      piVar3[1] = 1;
      Curl_dyn_reset(s);
      goto LAB_0012d3de;
    case 1:
      if (c == '-') {
        cVar8 = CURLFILETYPE_FILE;
      }
      else if (c == 'D') {
        cVar8 = CURLFILETYPE_DOOR;
      }
      else if (c == 'b') {
        cVar8 = CURLFILETYPE_DEVICE_BLOCK;
      }
      else if (c == 'c') {
        cVar8 = CURLFILETYPE_DEVICE_CHAR;
      }
      else if (c == 's') {
        cVar8 = CURLFILETYPE_SOCKET;
      }
      else if (c == 'l') {
        cVar8 = CURLFILETYPE_SYMLINK;
      }
      else if (c == 'p') {
        cVar8 = CURLFILETYPE_NAMEDPIPE;
      }
      else {
        if (c != 'd') goto LAB_0012df89;
        cVar8 = CURLFILETYPE_DIRECTORY;
      }
      (pfVar9->info).filetype = cVar8;
      piVar3[1] = 2;
      piVar3[6] = 0;
      piVar3[8] = 1;
      piVar3[9] = 0;
      break;
    case 2:
      uVar7 = piVar3[6] + 1;
      piVar3[6] = uVar7;
      if (uVar7 < 10) {
        pcVar11 = "rwx-tTsS";
        sStack_70 = 9;
        goto LAB_0012d94c;
      }
      if (uVar7 == 10) {
        if (c == ' ') {
          pcVar11[10] = '\0';
          lVar13 = *(long *)(piVar3 + 8);
          uVar7 = (uint)(pcVar11[lVar13] != '-') << 0x18;
          if (pcVar11[lVar13] == 'r') {
            uVar7 = 0x100;
          }
          if (pcVar11[lVar13 + 1] != '-') {
            if (pcVar11[lVar13 + 1] == 'w') {
              uVar7 = uVar7 | 0x80;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          cVar2 = pcVar11[lVar13 + 2];
          if (cVar2 != '-') {
            if (cVar2 == 'S') {
              uVar7 = uVar7 | 0x800;
            }
            else if (cVar2 == 's') {
              uVar7 = uVar7 | 0x840;
            }
            else if (cVar2 == 'x') {
              uVar7 = uVar7 | 0x40;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar11[lVar13 + 3] != '-') {
            if (pcVar11[lVar13 + 3] == 'r') {
              uVar7 = uVar7 | 0x20;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar11[lVar13 + 4] != '-') {
            if (pcVar11[lVar13 + 4] == 'w') {
              uVar7 = uVar7 | 0x10;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          cVar2 = pcVar11[lVar13 + 5];
          if (cVar2 != '-') {
            if (cVar2 == 'S') {
              uVar7 = uVar7 | 0x400;
            }
            else if (cVar2 == 's') {
              uVar7 = uVar7 | 0x408;
            }
            else if (cVar2 == 'x') {
              uVar7 = uVar7 | 8;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar11[lVar13 + 6] != '-') {
            if (pcVar11[lVar13 + 6] == 'r') {
              uVar7 = uVar7 | 4;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          if (pcVar11[lVar13 + 7] != '-') {
            if (pcVar11[lVar13 + 7] == 'w') {
              uVar7 = uVar7 | 2;
            }
            else {
              uVar7 = uVar7 | 0x1000000;
            }
          }
          cVar2 = pcVar11[lVar13 + 8];
          if (cVar2 != '-') {
            if (cVar2 == 'T') {
              uVar7 = uVar7 | 0x200;
            }
            else if (cVar2 == 't') {
              uVar7 = uVar7 | 0x201;
            }
            else {
              if (cVar2 != 'x') goto LAB_0012df98;
              uVar7 = uVar7 | 1;
            }
          }
          if (0xffffff < uVar7) goto LAB_0012df98;
          lVar4 = *(long *)(piVar3 + 4);
          puVar1 = (uint *)(lVar4 + 0x60);
          *puVar1 = *puVar1 | 8;
          *(uint *)(lVar4 + 0x18) = uVar7;
          *(long *)(piVar3 + 0x12) = lVar13;
          goto LAB_0012df1f;
        }
        goto LAB_0012df89;
      }
      break;
    case 3:
      iVar6 = piVar3[2];
      if (iVar6 == 1) {
        iVar6 = piVar3[6];
        piVar3[6] = iVar6 + 1U;
        if (c == ' ') {
          endptr = pcVar11 + *(long *)(piVar3 + 8);
          endptr[(ulong)(iVar6 + 1U) - 1] = '\0';
          iVar6 = Curl_str_number(&endptr,&hlinks,0x7fffffffffffffff);
          if (iVar6 == 0) {
            lVar13 = *(long *)(piVar3 + 4);
            puVar1 = (uint *)(lVar13 + 0x60);
            *puVar1 = *puVar1 | 0x80;
            *(curl_off_t *)(lVar13 + 0x30) = hlinks;
          }
          piVar3[6] = 0;
          piVar3[8] = 0;
          piVar3[9] = 0;
          piVar3[1] = 4;
          piVar3[2] = 0;
        }
        else {
LAB_0012da20:
          if (9 < (byte)(c - 0x30U)) goto LAB_0012df89;
        }
      }
      else {
LAB_0012d842:
        if ((iVar6 == 0) && (c != ' ')) {
          if ((byte)(c - 0x30U) < 10) goto LAB_0012d88a;
          goto LAB_0012df89;
        }
      }
      break;
    case 4:
      iVar6 = piVar3[2];
      if (iVar6 == 1) {
        iVar6 = piVar3[6];
        piVar3[6] = iVar6 + 1U;
        if (c == ' ') {
          pcVar11[((ulong)(iVar6 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0xc) = *(undefined8 *)(piVar3 + 8);
          piVar3[1] = 5;
          piVar3[2] = 0;
LAB_0012d82b:
          piVar3[8] = 0;
          piVar3[9] = 0;
          goto LAB_0012d8c9;
        }
      }
      else {
LAB_0012d877:
        if (iVar6 == 0) goto switchD_0012d684_caseD_0;
      }
      break;
    case 5:
      iVar6 = piVar3[2];
      if (iVar6 != 1) goto LAB_0012d877;
      iVar6 = piVar3[6];
      piVar3[6] = iVar6 + 1U;
      if (c == ' ') {
        pcVar11[((ulong)(iVar6 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
        *(undefined8 *)(piVar3 + 0xe) = *(undefined8 *)(piVar3 + 8);
        piVar3[1] = 6;
        piVar3[2] = 0;
        goto LAB_0012d82b;
      }
      break;
    case 6:
      iVar6 = piVar3[2];
      if (iVar6 != 1) goto LAB_0012d842;
      iVar6 = piVar3[6];
      piVar3[6] = iVar6 + 1U;
      if (c != ' ') goto LAB_0012da20;
      endptr = pcVar11 + *(long *)(piVar3 + 8);
      endptr[(ulong)(iVar6 + 1U) - 1] = '\0';
      iVar6 = Curl_str_numblanks(&endptr,&hlinks);
      if (iVar6 == 0) {
        if (hlinks != 0x7fffffffffffffff && *endptr == '\0') {
          lVar13 = *(long *)(piVar3 + 4);
          puVar1 = (uint *)(lVar13 + 0x60);
          *puVar1 = *puVar1 | 0x40;
          *(curl_off_t *)(lVar13 + 0x28) = hlinks;
        }
        piVar3[6] = 0;
        piVar3[8] = 0;
        piVar3[9] = 0;
        piVar3[1] = 7;
        piVar3[2] = 0;
      }
      break;
    case 7:
      switch(piVar3[2]) {
      case 0:
        if (c != ' ') {
          if ((9 < (byte)(c - 0x30U)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) goto LAB_0012df89;
          goto LAB_0012d88a;
        }
        break;
      case 1:
        piVar3[6] = piVar3[6] + 1;
        if (c == ' ') {
LAB_0012db20:
          piVar3[2] = 2;
        }
        else {
LAB_0012db2d:
          if ((0x19 < (byte)(c + 0x9fU) && 9 < (byte)(c - 0x30U)) &&
             (c != '.' && (byte)(c + 0xa5U) < 0xe6)) goto LAB_0012df89;
        }
        break;
      case 2:
        piVar3[6] = piVar3[6] + 1;
        if (c != ' ') {
          if (((byte)(c - 0x30U) < 10) || ((byte)((c & 0xdfU) + 0xbf) < 0x1a)) goto LAB_0012dc36;
          goto LAB_0012df89;
        }
        break;
      case 3:
        piVar3[6] = piVar3[6] + 1;
        if (c != ' ') goto LAB_0012db2d;
LAB_0012dc70:
        piVar3[2] = 4;
        break;
      case 4:
        piVar3[6] = piVar3[6] + 1;
        if (c != ' ') {
          if ((9 < (byte)(c - 0x30U)) && (0x19 < (byte)((c & 0xdfU) + 0xbf))) goto LAB_0012df89;
          piVar3[2] = 5;
        }
        break;
      case 5:
        iVar6 = piVar3[6];
        piVar3[6] = iVar6 + 1U;
        if (c == ' ') {
          pcVar11[((ulong)(iVar6 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0x10) = *(undefined8 *)(piVar3 + 8);
          if ((pfVar9->info).filetype == CURLFILETYPE_SYMLINK) {
            piVar3[1] = 9;
            piVar3[2] = 0;
          }
          else {
            piVar3[1] = 8;
            piVar3[2] = 0;
          }
        }
        else if (((((byte)(c - 0x3aU) < 0xf6) && ((byte)((c & 0xdfU) + 0xa5) < 0xe6)) && (c != '.'))
                && (c != ':')) goto LAB_0012df89;
      }
      break;
    case 8:
      iVar6 = piVar3[2];
      if (iVar6 == 2) {
        if (c != '\n') goto LAB_0012df89;
        uVar7 = piVar3[6];
      }
      else {
        if (iVar6 != 1) goto LAB_0012d877;
        uVar7 = piVar3[6] + 1;
        piVar3[6] = uVar7;
        if (c != '\n') {
          if (c == '\r') goto LAB_0012db20;
          break;
        }
      }
      pcVar11[((ulong)uVar7 - 1) + *(long *)(piVar3 + 8)] = '\0';
      *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
      piVar3[1] = 1;
      ftp_pl_insert_finfo(local_48,pfVar9);
      break;
    case 9:
      switch(piVar3[2]) {
      case 0:
switchD_0012d684_caseD_0:
        if (c != ' ') {
LAB_0012d88a:
          *(size_t *)(piVar3 + 8) = sVar10 - 1;
          piVar3[6] = 1;
          piVar3[2] = 1;
        }
        break;
      case 1:
        piVar3[6] = piVar3[6] + 1;
        if (c == ' ') goto LAB_0012db20;
        if ((c == '\n') || (c == '\r')) goto LAB_0012df89;
        break;
      case 2:
        piVar3[6] = piVar3[6] + 1;
        if (c != '-') goto LAB_0012dc51;
LAB_0012dc36:
        piVar3[2] = 3;
        break;
      case 3:
        piVar3[6] = piVar3[6] + 1;
        if (c == '>') goto LAB_0012dc70;
LAB_0012dc51:
        if (c != '\n') {
joined_r0x0012dc21:
          if (c != '\r') goto LAB_0012dc63;
        }
        goto LAB_0012df89;
      case 4:
        iVar6 = piVar3[6];
        piVar3[6] = iVar6 + 1U;
        if (c != ' ') {
          if (c == '\n') goto LAB_0012df89;
          goto joined_r0x0012dc21;
        }
        piVar3[2] = 5;
        pcVar11[((ulong)(iVar6 + 1U) - 4) + *(long *)(piVar3 + 8)] = '\0';
        *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
        piVar3[6] = 0;
        piVar3[8] = 0;
        piVar3[9] = 0;
        break;
      case 5:
        if ((c == '\n') || (c == '\r')) goto LAB_0012df89;
        piVar3[2] = 6;
        *(size_t *)(piVar3 + 8) = sVar10 - 1;
        piVar3[6] = 1;
        break;
      case 6:
        uVar7 = piVar3[6] + 1;
        piVar3[6] = uVar7;
        if (c == '\n') {
LAB_0012df40:
          pcVar11[((ulong)uVar7 - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 0x14) = *(undefined8 *)(piVar3 + 8);
          ftp_pl_insert_finfo(local_48,pfVar9);
          piVar3[1] = 1;
        }
        else if (c == '\r') {
          piVar3[2] = 7;
        }
        break;
      case 7:
        if (c == '\n') {
          uVar7 = piVar3[6];
          goto LAB_0012df40;
        }
LAB_0012df89:
        piVar3[3] = 0x57;
        uVar15 = local_58;
        goto LAB_0012dfa0;
      }
    }
  }
  uVar14 = uVar14 + 1;
  goto LAB_0012d3de;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard->ftpwc;
  struct ftp_parselist_data *parser = ftpwc->parser;
  size_t i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is handled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = ISDIGIT(buffer[0]) ? OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */
    char *mem;
    size_t len; /* number of bytes of data in the dynbuf */
    char c = buffer[i];
    struct fileinfo *infop;
    struct curl_fileinfo *finfo;
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->item_offset = 0;
      parser->item_length = 0;
      Curl_dyn_init(&parser->file_data->buf, MAX_FTPLIST_BUFFER);
    }

    infop = parser->file_data;
    finfo = &infop->info;

    if(Curl_dyn_addn(&infop->buf, &c, 1)) {
      parser->error = CURLE_OUT_OF_MEMORY;
      goto fail;
    }
    len = Curl_dyn_len(&infop->buf);
    mem = Curl_dyn_ptr(&infop->buf);

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            Curl_dyn_reset(&infop->buf);
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            Curl_dyn_setlen(&infop->buf, --len);
          }
          else if(c == '\n') {
            mem[parser->item_length - 1] = 0;
            if(!strncmp("total ", mem, 6)) {
              const char *endptr = mem + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              Curl_str_passblanks(&endptr);
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              Curl_dyn_reset(&infop->buf);
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          mem[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(mem + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            const char *p = &mem[parser->item_offset];
            curl_off_t hlinks;
            mem[parser->item_offset + parser->item_length - 1] = 0;

            if(!Curl_str_number(&p, &hlinks, LONG_MAX)) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = (long)hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            const char *p = mem + parser->item_offset;
            curl_off_t fsize;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(!Curl_str_numblanks(&p, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = len -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->mem + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            mem[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = len - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", mem + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              const char *p = mem + parser->item_offset;
              if(Curl_str_numblanks(&p, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            mem[len - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            mem[len - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}